

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O2

ScalarFunction * duckdb::CanCastImplicitlyFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff3c;
  FunctionNullHandling in_stack_ffffffffffffff48;
  allocator_type local_b1;
  code *bind_lambda;
  LogicalType local_90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60;
  LogicalType local_48 [2];
  
  LogicalType::LogicalType(local_48,ANY);
  LogicalType::LogicalType(local_48 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,&local_b1);
  LogicalType::LogicalType(&local_90,BOOLEAN);
  bind_lambda = CanCastImplicitlyFunction;
  LogicalType::LogicalType(&local_60,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_60;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff34;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff3c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_78,&local_90,
             (scalar_function_t *)&stack0xffffffffffffff50,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff48,bind_lambda);
  LogicalType::~LogicalType(&local_60);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff50);
  LogicalType::~LogicalType(&local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->bind_expression = BindCanCastImplicitlyExpression;
  return in_RDI;
}

Assistant:

ScalarFunction CanCastImplicitlyFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY, LogicalType::ANY}, LogicalType::BOOLEAN, CanCastImplicitlyFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.bind_expression = BindCanCastImplicitlyExpression;
	return fun;
}